

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArealObjectStatePdu.cpp
# Opt level: O1

int __thiscall DIS::ArealObjectStatePdu::getMarshalledSize(ArealObjectStatePdu *this)

{
  double *pdVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  pointer pVVar8;
  ulong uVar9;
  long lVar10;
  Vector3Double listElement;
  Vector3Double local_50;
  
  iVar2 = SyntheticEnvironmentFamilyPdu::getMarshalledSize
                    (&this->super_SyntheticEnvironmentFamilyPdu);
  iVar3 = EntityID::getMarshalledSize(&this->_objectID);
  iVar4 = EntityID::getMarshalledSize(&this->_referencedObjectID);
  iVar5 = EntityType::getMarshalledSize(&this->_objectType);
  iVar6 = SimulationAddress::getMarshalledSize(&this->_requesterID);
  iVar7 = SimulationAddress::getMarshalledSize(&this->_receivingID);
  iVar2 = iVar7 + iVar5 + iVar4 + iVar3 + iVar2 + iVar6 + 0xc;
  pVVar8 = (this->_objectLocation).
           super__Vector_base<DIS::Vector3Double,_std::allocator<DIS::Vector3Double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->_objectLocation).
      super__Vector_base<DIS::Vector3Double,_std::allocator<DIS::Vector3Double>_>._M_impl.
      super__Vector_impl_data._M_finish != pVVar8) {
    lVar10 = 8;
    uVar9 = 0;
    do {
      local_50._vptr_Vector3Double = (_func_int **)&PTR__Vector3Double_001b6748;
      local_50._z = *(double *)((long)&pVVar8->_y + lVar10);
      pdVar1 = (double *)((long)&pVVar8->_vptr_Vector3Double + lVar10);
      local_50._x = *pdVar1;
      local_50._y = pdVar1[1];
      iVar3 = Vector3Double::getMarshalledSize(&local_50);
      iVar2 = iVar2 + iVar3;
      Vector3Double::~Vector3Double(&local_50);
      uVar9 = uVar9 + 1;
      pVVar8 = (this->_objectLocation).
               super__Vector_base<DIS::Vector3Double,_std::allocator<DIS::Vector3Double>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar10 = lVar10 + 0x20;
    } while (uVar9 < (ulong)((long)(this->_objectLocation).
                                   super__Vector_base<DIS::Vector3Double,_std::allocator<DIS::Vector3Double>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar8 >> 5));
  }
  return iVar2;
}

Assistant:

int ArealObjectStatePdu::getMarshalledSize() const
{
   int marshalSize = 0;

   marshalSize = SyntheticEnvironmentFamilyPdu::getMarshalledSize();
   marshalSize = marshalSize + _objectID.getMarshalledSize();  // _objectID
   marshalSize = marshalSize + _referencedObjectID.getMarshalledSize();  // _referencedObjectID
   marshalSize = marshalSize + 2;  // _updateNumber
   marshalSize = marshalSize + 1;  // _forceID
   marshalSize = marshalSize + 1;  // _modifications
   marshalSize = marshalSize + _objectType.getMarshalledSize();  // _objectType
   marshalSize = marshalSize + 4;  // _specificObjectAppearance
   marshalSize = marshalSize + 2;  // _generalObjectAppearance
   marshalSize = marshalSize + 2;  // _numberOfPoints
   marshalSize = marshalSize + _requesterID.getMarshalledSize();  // _requesterID
   marshalSize = marshalSize + _receivingID.getMarshalledSize();  // _receivingID

   for(unsigned long long idx=0; idx < _objectLocation.size(); idx++)
   {
        Vector3Double listElement = _objectLocation[idx];
        marshalSize = marshalSize + listElement.getMarshalledSize();
    }

    return marshalSize;
}